

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

void __thiscall Parser::AddFastScannedRegExpNode(Parser *this,ParseNodePtr pnode)

{
  RealCount *pRVar1;
  DListNodeBase<ParseNode_*> *pDVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  NodeDList *pNVar6;
  anon_union_8_3_7fb8a913_for_next *paVar7;
  
  if (this->m_isInBackground == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x3061,"(!IsBackgroundParser())","!IsBackgroundParser()");
    if (!bVar4) goto LAB_00e85413;
    *puVar5 = 0;
  }
  if (this->m_doingFastScan == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x3062,"(m_doingFastScan)","m_doingFastScan");
    if (!bVar4) {
LAB_00e85413:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  if (this->fastScannedRegExpNodes == (NodeDList *)0x0) {
    pNVar6 = (NodeDList *)new<Memory::ArenaAllocator>(0x20,&this->m_nodeAllocator,0x366bee);
    (pNVar6->super_DListBase<ParseNode_*,_RealCount>).super_RealCount.count = 0;
    (pNVar6->super_DListBase<ParseNode_*,_RealCount>).super_DListNodeBase<ParseNode_*>.next.node =
         (DListNode<ParseNode_*> *)pNVar6;
    (pNVar6->super_DListBase<ParseNode_*,_RealCount>).super_DListNodeBase<ParseNode_*>.prev.list =
         (DListBase<ParseNode_*,_RealCount> *)pNVar6;
    pNVar6->allocator = &this->m_nodeAllocator;
    this->fastScannedRegExpNodes = pNVar6;
  }
  pNVar6 = this->fastScannedRegExpNodes;
  paVar7 = (anon_union_8_3_7fb8a913_for_next *)
           new<Memory::ArenaAllocator>(0x18,pNVar6->allocator,0x366bee);
  paVar7[2].base = (DListNodeBase<ParseNode_*> *)pnode;
  pDVar2 = (pNVar6->super_DListBase<ParseNode_*,_RealCount>).super_DListNodeBase<ParseNode_*>.prev.
           base;
  paVar7[1].base = pDVar2;
  *paVar7 = pDVar2->next;
  *(anon_union_8_3_7fb8a913_for_next **)((long)pDVar2->next + 8) = paVar7;
  (pDVar2->next).base = (DListNodeBase<ParseNode_*> *)paVar7;
  pRVar1 = &(pNVar6->super_DListBase<ParseNode_*,_RealCount>).super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  return;
}

Assistant:

void Parser::AddFastScannedRegExpNode(ParseNodePtr const pnode)
{
    Assert(!IsBackgroundParser());
    Assert(m_doingFastScan);

    if (fastScannedRegExpNodes == nullptr)
    {
        fastScannedRegExpNodes = Anew(&m_nodeAllocator, NodeDList, &m_nodeAllocator);
    }
    fastScannedRegExpNodes->Append(pnode);
}